

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerInlineSpreadArgOutLoopUsingRegisters
          (Lowerer *this,Instr *callInstr,RegOpnd *indexOpnd,RegOpnd *arrayElementsStartOpnd)

{
  Func *pFVar1;
  Loop *pLVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  BYTE scale;
  byte bVar6;
  LabelInstr *target;
  IntConstOpnd *pIVar7;
  LabelInstr *target_00;
  undefined4 *puVar8;
  IndirOpnd *src;
  Instr *pIVar9;
  RegOpnd *pRVar10;
  Lowerer *pLVar11;
  LowererMDArch *this_00;
  
  pFVar1 = callInstr->m_func;
  target = IR::LabelInstr::New(Label,pFVar1,false);
  pLVar11 = (Lowerer *)&DAT_00000001;
  pIVar7 = IR::IntConstOpnd::New(1,TyUint8,pFVar1,false);
  InsertCompareBranch(pLVar11,&indexOpnd->super_Opnd,&pIVar7->super_Opnd,BrEq_A,true,target,
                      callInstr,false);
  target_00 = InsertLoopTopLabel(this,callInstr);
  if ((target_00->field_0x78 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
    if (!bVar5) goto LAB_005ebddc;
    *puVar8 = 0;
  }
  pLVar2 = target_00->m_loop;
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar2->regAlloc).liveOnBackEdgeSyms,(indexOpnd->m_sym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar2->regAlloc).liveOnBackEdgeSyms,(arrayElementsStartOpnd->m_sym->super_Sym).m_id);
  pIVar7 = IR::IntConstOpnd::New(1,TyInt8,pFVar1,false);
  InsertSub(false,&indexOpnd->super_Opnd,&indexOpnd->super_Opnd,&pIVar7->super_Opnd,callInstr);
  scale = LowererMDArch::GetDefaultIndirScale();
  src = IR::IndirOpnd::New(arrayElementsStartOpnd,indexOpnd,scale,TyUint64,pFVar1);
  pIVar9 = IR::Instr::New(ArgOut_A_Dynamic,pFVar1);
  pRVar10 = IR::RegOpnd::New(TyUint64,pFVar1);
  InsertMove(&pRVar10->super_Opnd,&src->super_Opnd,callInstr,true);
  if (pIVar9->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ebddc;
    *puVar8 = 0;
  }
  pFVar3 = pIVar9->m_func;
  if ((pRVar10->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_005ebddc;
    *puVar8 = 0;
  }
  bVar6 = (pRVar10->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    pRVar10 = (RegOpnd *)IR::Opnd::Copy(&pRVar10->super_Opnd,pFVar3);
    bVar6 = (pRVar10->super_Opnd).field_0xb;
  }
  (pRVar10->super_Opnd).field_0xb = bVar6 | 2;
  pIVar9->m_src1 = &pRVar10->super_Opnd;
  if (pIVar9->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ebddc;
    *puVar8 = 0;
  }
  pFVar3 = pIVar9->m_func;
  if ((indexOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_005ebddc;
    *puVar8 = 0;
  }
  bVar6 = (indexOpnd->super_Opnd).field_0xb;
  pRVar10 = indexOpnd;
  if ((bVar6 & 2) != 0) {
    pRVar10 = (RegOpnd *)IR::Opnd::Copy(&indexOpnd->super_Opnd,pFVar3);
    bVar6 = (pRVar10->super_Opnd).field_0xb;
  }
  (pRVar10->super_Opnd).field_0xb = bVar6 | 2;
  pIVar9->m_src2 = &pRVar10->super_Opnd;
  IR::Instr::InsertBefore(callInstr,pIVar9);
  this_00 = &(this->m_lowererMD).lowererMDArch;
  LowererMDArch::LoadDynamicArgumentUsingLength(this_00,pIVar9);
  pLVar11 = (Lowerer *)&DAT_00000001;
  pIVar7 = IR::IntConstOpnd::New(1,TyUint8,pFVar1,false);
  InsertCompareBranch(pLVar11,&indexOpnd->super_Opnd,&pIVar7->super_Opnd,BrNeq_A,true,target_00,
                      callInstr,false);
  IR::Instr::InsertBefore(callInstr,&target->super_Instr);
  pIVar9 = IR::Instr::New(ArgOut_A_Dynamic,pFVar1);
  if (pIVar9->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ebddc;
    *puVar8 = 0;
  }
  pFVar1 = pIVar9->m_func;
  if ((src->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) {
LAB_005ebddc:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  bVar6 = (src->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    src = (IndirOpnd *)IR::Opnd::Copy(&src->super_Opnd,pFVar1);
    bVar6 = (src->super_Opnd).field_0xb;
  }
  (src->super_Opnd).field_0xb = bVar6 | 2;
  pIVar9->m_src1 = &src->super_Opnd;
  IR::Instr::InsertBefore(callInstr,pIVar9);
  LowererMDArch::LoadDynamicArgument(this_00,pIVar9,4);
  return;
}

Assistant:

void
Lowerer::LowerInlineSpreadArgOutLoopUsingRegisters(IR::Instr *callInstr, IR::RegOpnd *indexOpnd, IR::RegOpnd *arrayElementsStartOpnd)
{
    Func *const func = callInstr->m_func;

    IR::LabelInstr *oneArgLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertCompareBranch(indexOpnd, IR::IntConstOpnd::New(1, TyUint8, func), Js::OpCode::BrEq_A, true, oneArgLabel, callInstr);

    IR::LabelInstr *startLoopLabel = InsertLoopTopLabel(callInstr);
    Loop * loop = startLoopLabel->GetLoop();
    loop->regAlloc.liveOnBackEdgeSyms->Set(indexOpnd->m_sym->m_id);
    loop->regAlloc.liveOnBackEdgeSyms->Set(arrayElementsStartOpnd->m_sym->m_id);
    InsertSub(false, indexOpnd, indexOpnd, IR::IntConstOpnd::New(1, TyInt8, func), callInstr);

    IR::IndirOpnd *elemPtrOpnd = IR::IndirOpnd::New(arrayElementsStartOpnd, indexOpnd, this->m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);

    // Generate argout for n+2 arg (skipping function object + this)
    IR::Instr *argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);

    // X64 requires a reg opnd
    IR::RegOpnd *elemRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    Lowerer::InsertMove(elemRegOpnd, elemPtrOpnd, callInstr);
    argout->SetSrc1(elemRegOpnd);
    argout->SetSrc2(indexOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgumentUsingLength(argout);

    InsertCompareBranch(indexOpnd, IR::IntConstOpnd::New(1, TyUint8, func), Js::OpCode::BrNeq_A, true, startLoopLabel, callInstr);

    // Emit final argument into register 4 on AMD64 and ARM
    callInstr->InsertBefore(oneArgLabel);
    argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
    argout->SetSrc1(elemPtrOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgument(argout, 4); //4 to denote this is 4th register after this, callinfo & function object
}